

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O3

TPM_RC TPM2_GetCapability(TSS_DEVICE *tpm,TPM_CAP capability,UINT32 property,UINT32 propertyCount,
                         TPMI_YES_NO *moreData,TPMS_CAPABILITY_DATA *capabilityData)

{
  UINT16 UVar1;
  TPM_RC TVar2;
  TPM_RC TVar3;
  INT32 sizeParamBuf;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT CmdCtx;
  INT32 local_3068;
  UINT32 local_3064;
  UINT32 local_3060;
  TPM_CAP local_305c;
  BYTE *local_3058;
  TSS_CMD_CONTEXT local_3050;
  
  local_3068 = 0x1000;
  local_3058 = local_3050.ParamBuffer;
  local_3050.ParamSize = 0;
  local_3064 = propertyCount;
  local_3060 = property;
  local_305c = capability;
  UVar1 = UINT32_Marshal(&local_305c,&local_3058,&local_3068);
  local_3050.ParamSize = local_3050.ParamSize + UVar1;
  UVar1 = UINT32_Marshal(&local_3060,&local_3058,&local_3068);
  local_3050.ParamSize = local_3050.ParamSize + UVar1;
  UVar1 = UINT32_Marshal(&local_3064,&local_3058,&local_3068);
  local_3050.ParamSize = local_3050.ParamSize + UVar1;
  TVar2 = TSS_DispatchCmd(tpm,0x17a,(TPM_HANDLE *)0x0,0,(TSS_SESSION **)0x0,0,&local_3050);
  if (TVar2 == 0) {
    TVar3 = TPMI_YES_NO_Unmarshal
                      (moreData,&local_3050.RespBufPtr,(INT32 *)&local_3050.RespBytesLeft);
    TVar2 = 0x9a;
    if (TVar3 == 0) {
      TVar3 = TPMS_CAPABILITY_DATA_Unmarshal
                        (capabilityData,&local_3050.RespBufPtr,(INT32 *)&local_3050.RespBytesLeft);
      TVar2 = 0x9a;
      if (TVar3 == 0) {
        TVar2 = 0;
      }
    }
  }
  return TVar2;
}

Assistant:

TPM_RC
TPM2_GetCapability(
    TSS_DEVICE             *tpm,                // IN/OUT
    TPM_CAP                 capability,         // IN
    UINT32                  property,           // IN
    UINT32                  propertyCount,      // IN
    TPMI_YES_NO            *moreData,           // OUT
    TPMS_CAPABILITY_DATA   *capabilityData      // OUT
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL(TPM_CAP, &capability);
    TSS_MARSHAL(UINT32, &property);
    TSS_MARSHAL(UINT32, &propertyCount);
    DISPATCH_CMD(GetCapability, NULL, 0, NULL, 0);
    TSS_UNMARSHAL(TPMI_YES_NO, moreData);
    TSS_UNMARSHAL(TPMS_CAPABILITY_DATA, capabilityData);
    END_CMD();
}